

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# units.cpp
# Opt level: O3

void __thiscall
Units_hasUnlinkedUnitsWhenBaseUnitsAddedToModelAfterNameUsedForVariableUnits_Test::TestBody
          (Units_hasUnlinkedUnitsWhenBaseUnitsAddedToModelAfterNameUsedForVariableUnits_Test *this)

{
  char cVar1;
  ModelPtr m;
  AssertionResult gtest_ar_;
  VariablePtr v1;
  ComponentPtr c1;
  UnitsPtr u1;
  long *local_90;
  AssertionResult local_88;
  long local_78 [2];
  AssertHelper local_68 [8];
  shared_ptr *local_60;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_58;
  char local_50 [8];
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  local_48;
  string *local_40;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_38;
  shared_ptr *local_30;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_28;
  string *local_20;
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_18;
  
  libcellml::Model::create();
  libcellml::Component::create();
  libcellml::Units::create();
  libcellml::Variable::create();
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a_unit","");
  libcellml::NamedEntity::setName(local_20);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Component::addVariable(local_30);
  libcellml::ComponentEntity::addComponent(local_60);
  local_88._0_8_ = local_78;
  std::__cxx11::string::_M_construct<char_const*>((string *)&local_88,"a_unit","");
  libcellml::Variable::setUnits(local_40);
  if ((long *)local_88._0_8_ != local_78) {
    operator_delete((void *)local_88._0_8_,local_78[0] + 1);
  }
  libcellml::Model::addUnits(local_60);
  local_50[0] = libcellml::Model::hasUnlinkedUnits();
  local_48.ptr_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  if (local_50[0] == '\0') {
    testing::Message::Message((Message *)&local_90);
    testing::internal::GetBoolAssertionFailureMessage_abi_cxx11_
              (&local_88,local_50,"m->hasUnlinkedUnits()","false");
    testing::internal::AssertHelper::AssertHelper
              (local_68,kNonFatalFailure,
               "/workspace/llm4binary/github/license_c_cmakelists/cellml[P]libcellml/tests/units/units.cpp"
               ,0x1c4,(char *)local_88._0_8_);
    testing::internal::AssertHelper::operator=(local_68,(Message *)&local_90);
    testing::internal::AssertHelper::~AssertHelper(local_68);
    if ((long *)local_88._0_8_ != local_78) {
      operator_delete((void *)local_88._0_8_,local_78[0] + 1);
    }
    if (local_90 != (long *)0x0) {
      cVar1 = testing::internal::IsTrue(true);
      if ((cVar1 != '\0') && (local_90 != (long *)0x0)) {
        (**(code **)(*local_90 + 8))();
      }
    }
  }
  testing::internal::
  scoped_ptr<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>::
  reset(&local_48,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0);
  if (local_38 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_38);
  }
  if (local_18 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_18);
  }
  if (local_28 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_28);
  }
  if (local_58 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
    std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_58);
  }
  return;
}

Assistant:

TEST(Units, hasUnlinkedUnitsWhenBaseUnitsAddedToModelAfterNameUsedForVariableUnits)
{
    libcellml::ModelPtr m = libcellml::Model::create();
    libcellml::ComponentPtr c1 = libcellml::Component::create();
    libcellml::UnitsPtr u1 = libcellml::Units::create();
    libcellml::VariablePtr v1 = libcellml::Variable::create();

    u1->setName("a_unit");

    c1->addVariable(v1);
    m->addComponent(c1);

    v1->setUnits("a_unit");
    m->addUnits(u1);

    EXPECT_TRUE(m->hasUnlinkedUnits());
}